

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_opt_result
ggml_opt_adam(ggml_context *ctx,ggml_opt_params params,ggml_tensor *f,ggml_cgraph *gf,
             ggml_cgraph *gb)

{
  float __x;
  float __x_00;
  float v_00;
  float *z;
  float *x_00;
  float *y;
  float *x_01;
  float *x_02;
  float *y_00;
  float *y_01;
  _Bool _Var1;
  int iVar2;
  ggml_tensor *pgVar3;
  ggml_cgraph *in_RCX;
  int iVar4;
  int *in_RDX;
  ggml_tensor *in_RSI;
  ggml_context *in_RDI;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int64_t t_end_wall;
  int64_t t_end_cpu;
  float rate;
  float fx;
  int64_t t_start_cpu;
  int64_t t_start_wall;
  int i_1;
  int t;
  float fx_best;
  int n_no_improvement;
  float fx_prev;
  float *pf;
  float *vh;
  float *mh;
  float *v;
  float *m;
  float *g2;
  float *g1;
  float *x;
  float eps;
  float beta2;
  float beta1;
  float alpha;
  int i;
  int nx;
  int np;
  ggml_tensor *ps [16];
  int in_stack_fffffffffffffe78;
  ggml_type in_stack_fffffffffffffe7c;
  ggml_cgraph *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  float *in_stack_fffffffffffffe90;
  ggml_cgraph *pgVar8;
  ggml_cgraph *pgVar9;
  ggml_tensor *tensor;
  int local_11c;
  int local_118;
  float local_114;
  int local_110;
  float local_10c;
  float v_01;
  int n;
  int in_stack_ffffffffffffff5c;
  float in_stack_ffffffffffffffbc;
  float *in_stack_ffffffffffffffc0;
  float *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd4;
  
  tensor = (ggml_tensor *)&stack0x00000008;
  _Var1 = ggml_is_scalar(in_RSI);
  if (!_Var1) {
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0x26c2,
            "ggml_is_scalar(f)");
    abort();
  }
  in_RDX[2] = tensor->n_dims;
  in_RCX->n_threads = tensor->n_dims;
  n = 0;
  iVar2 = 0;
  for (v_01 = 0.0; (int)v_01 < *in_RDX; v_01 = (float)((int)v_01 + 1)) {
    iVar4 = iVar2;
    if ((*(byte *)(*(long *)(in_RDX + (long)(int)v_01 * 2 + 8) + 0x3c) & 1) != 0) {
      if (0xf < iVar2) {
        fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",
                0x26d0,"np < GGML_MAX_PARAMS");
        abort();
      }
      iVar4 = iVar2 + 1;
      *(undefined8 *)(&stack0xffffffffffffff58 + (long)iVar2 * 8) =
           *(undefined8 *)(in_RDX + (long)(int)v_01 * 2 + 8);
      iVar2 = ggml_nelements(*(ggml_tensor **)(in_RDX + (long)(int)v_01 * 2 + 8));
      n = iVar2 + n;
    }
    iVar2 = iVar4;
  }
  __x = *(float *)(tensor->nb + 1);
  __x_00 = *(float *)((long)tensor->nb + 0xc);
  v_00 = *(float *)(tensor->nb + 2);
  pgVar3 = ggml_new_tensor_1d((ggml_context *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                              in_stack_fffffffffffffe78);
  z = (float *)pgVar3->data;
  pgVar3 = ggml_new_tensor_1d((ggml_context *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                              in_stack_fffffffffffffe78);
  x_00 = (float *)pgVar3->data;
  pgVar3 = ggml_new_tensor_1d((ggml_context *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                              in_stack_fffffffffffffe78);
  y = (float *)pgVar3->data;
  pgVar3 = ggml_new_tensor_1d((ggml_context *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                              in_stack_fffffffffffffe78);
  x_01 = (float *)pgVar3->data;
  pgVar3 = ggml_new_tensor_1d((ggml_context *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                              in_stack_fffffffffffffe78);
  x_02 = (float *)pgVar3->data;
  pgVar3 = ggml_new_tensor_1d((ggml_context *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                              in_stack_fffffffffffffe78);
  y_00 = (float *)pgVar3->data;
  pgVar3 = ggml_new_tensor_1d((ggml_context *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                              in_stack_fffffffffffffe78);
  y_01 = (float *)pgVar3->data;
  if (tensor->ne[0] < 1) {
    pgVar8 = (ggml_cgraph *)0x0;
  }
  else {
    pgVar3 = ggml_new_tensor_1d((ggml_context *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                                in_stack_fffffffffffffe78);
    pgVar8 = (ggml_cgraph *)pgVar3->data;
  }
  pgVar9 = pgVar8;
  ggml_vec_set_f32(n,x_01,0.0);
  ggml_vec_set_f32(n,x_02,0.0);
  ggml_opt_get_params((int)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                      (ggml_tensor **)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                      (float *)in_stack_fffffffffffffe80);
  ggml_graph_reset(in_stack_fffffffffffffe80);
  ggml_set_f32(tensor,(float)((ulong)pgVar9 >> 0x20));
  ggml_graph_compute(in_RDI,in_RCX);
  local_114 = ggml_get_f32_1d((ggml_tensor *)
                              CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                              (int)((ulong)in_stack_fffffffffffffe80 >> 0x20));
  if (pgVar8 != (ggml_cgraph *)0x0) {
    pgVar8->n_nodes = (int)local_114;
  }
  local_110 = 0;
  local_118 = 0;
  local_10c = local_114;
  while( true ) {
    iVar4 = (int)((ulong)in_stack_fffffffffffffe90 >> 0x20);
    if ((int)tensor->nb[0] <= local_118) {
      return GGML_OPT_DID_NOT_CONVERGE;
    }
    for (local_11c = 0; local_11c < iVar2; local_11c = local_11c + 1) {
    }
    ggml_time_us();
    ggml_cycles();
    ggml_opt_get_grad(iVar4,(ggml_tensor **)
                            CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                      (float *)in_stack_fffffffffffffe80);
    ggml_vec_scale_f32(in_stack_ffffffffffffff5c,(float *)CONCAT44(iVar2,n),v_01);
    ggml_vec_mad_f32(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                     in_stack_ffffffffffffffbc);
    ggml_vec_sqr_f32(n,y,x_00);
    ggml_vec_scale_f32(in_stack_ffffffffffffff5c,(float *)CONCAT44(iVar2,n),v_01);
    ggml_vec_mad_f32(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                     in_stack_ffffffffffffffbc);
    ggml_vec_cpy_f32(n,y_00,x_01);
    in_stack_fffffffffffffe8c = n;
    ggml_vec_cpy_f32(n,y_01,x_02);
    in_stack_fffffffffffffe90 = y_00;
    n = in_stack_fffffffffffffe8c;
    powf(__x,(float)(local_118 + 1));
    ggml_vec_scale_f32(in_stack_ffffffffffffff5c,(float *)CONCAT44(iVar2,n),v_01);
    powf(__x_00,(float)(local_118 + 1));
    ggml_vec_scale_f32(in_stack_ffffffffffffff5c,(float *)CONCAT44(iVar2,n),v_01);
    ggml_vec_sqrt_f32((int)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                      (float *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                      (float *)in_stack_fffffffffffffe80);
    ggml_vec_acc1_f32(n,y_01,v_00);
    ggml_vec_div_f32(n,y_00,y_00,y_01);
    ggml_vec_sub_f32(n,z,z,y_00);
    ggml_opt_set_params((int)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                        (ggml_tensor **)
                        CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                        (float *)in_stack_fffffffffffffe80);
    ggml_graph_reset(in_stack_fffffffffffffe80);
    ggml_set_f32(tensor,(float)((ulong)pgVar9 >> 0x20));
    ggml_graph_compute(in_RDI,in_RCX);
    fVar5 = ggml_get_f32_1d((ggml_tensor *)
                            CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                            (int)((ulong)in_stack_fffffffffffffe80 >> 0x20));
    auVar7._8_4_ = 0x7fffffff;
    auVar7._0_8_ = 0x7fffffff7fffffff;
    auVar7._12_4_ = 0x7fffffff;
    auVar7 = vpand_avx(ZEXT416((uint)(fVar5 - local_10c)),auVar7);
    if (auVar7._0_4_ / fVar5 < *(float *)((long)tensor->nb + 0x14)) break;
    if (pgVar8 != (ggml_cgraph *)0x0) {
      if ((tensor->ne[0] <= local_118) &&
         (auVar6._0_8_ = (double)((*(float *)((long)pgVar8->nodes +
                                             (long)(local_118 % tensor->ne[0]) * 4 + -0x20) - fVar5)
                                 / fVar5), auVar6._8_8_ = 0,
         auVar7 = vpand_avx(auVar6,_DAT_00170200), auVar7._0_8_ < (double)(float)tensor->ne[1])) {
        return GGML_OPT_OK;
      }
      *(float *)((long)pgVar8->nodes + (long)(local_118 % tensor->ne[0]) * 4 + -0x20) = fVar5;
      in_stack_fffffffffffffe80 = pgVar8;
    }
    if (0 < tensor->ne[2]) {
      if (local_114 <= fVar5) {
        local_110 = local_110 + 1;
        if (tensor->ne[2] <= local_110) {
          return GGML_OPT_OK;
        }
      }
      else {
        local_110 = 0;
        local_114 = fVar5;
      }
    }
    ggml_cycles();
    ggml_time_us();
    local_118 = local_118 + 1;
    local_10c = fVar5;
  }
  return GGML_OPT_OK;
}

Assistant:

static enum ggml_opt_result ggml_opt_adam(
        struct ggml_context * ctx,
        struct ggml_opt_params params,
        struct ggml_tensor * f,
        struct ggml_cgraph * gf,
        struct ggml_cgraph * gb) {
    GGML_ASSERT(ggml_is_scalar(f));

    gf->n_threads = params.n_threads;
    gb->n_threads = params.n_threads;

    // these will store the parameters we want to optimize
    struct ggml_tensor * ps[GGML_MAX_PARAMS];

    int np = 0;
    int nx = 0;
    for (int i = 0; i < gf->n_nodes; ++i) {
        if (gf->nodes[i]->is_param) {
            GGML_PRINT_DEBUG("found param %d: grad->op = %d\n", np, gf->nodes[i]->grad->op);

            GGML_ASSERT(np < GGML_MAX_PARAMS);

            ps[np++] = gf->nodes[i];
            nx += ggml_nelements(gf->nodes[i]);
        }
    }

    // constants
    const float alpha = params.adam.alpha;
    const float beta1 = params.adam.beta1;
    const float beta2 = params.adam.beta2;
    const float eps   = params.adam.eps;

    float * x  = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, nx)->data; // view of the parameters
    float * g1 = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, nx)->data; // gradient
    float * g2 = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, nx)->data; // gradient squared
    float * m  = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, nx)->data; // first moment
    float * v  = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, nx)->data; // second moment
    float * mh = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, nx)->data; // first moment hat
    float * vh = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, nx)->data; // second moment hat

    float * pf = params.past > 0 ? ggml_new_tensor_1d(ctx, GGML_TYPE_F32, params.past)->data : NULL; // past function values

    // initialize
    ggml_vec_set_f32(nx, m, 0.0f);
    ggml_vec_set_f32(nx, v, 0.0f);

    // update view
    ggml_opt_get_params(np, ps, x);

    // compute the function value
    ggml_graph_reset  (gf);
    ggml_set_f32      (f->grad, 1.0f);
    ggml_graph_compute(ctx, gb);

    float fx_prev = ggml_get_f32_1d(f, 0);
    if (pf) {
        pf[0] = fx_prev;
    }

    int n_no_improvement = 0;
    float fx_best = fx_prev;

    // run the optimizer
    for (int t = 0; t < params.adam.n_iter; ++t) {
        GGML_PRINT_DEBUG  ("=== iter %d ===\n", t);

        GGML_PRINT_DEBUG  ("f      = %10.6f\n", ggml_get_f32_1d(f, 0));
        GGML_PRINT_DEBUG_5("df/dx0 = %10.6f\n", ggml_get_f32_1d(ps[0]->grad, 0));
        GGML_PRINT_DEBUG_5("df/dx1 = %10.6f\n", ggml_get_f32_1d(ps[1]->grad, 0));

        for (int i = 0; i < np; ++i) {
            GGML_PRINT_DEBUG("param %d: %10.6f, g = %10.6f\n", i,
                    ggml_get_f32_1d(ps[i], 0), ggml_get_f32_1d(ps[i]->grad, 0));
        }

        const int64_t t_start_wall = ggml_time_us();
        const int64_t t_start_cpu = ggml_cycles();
        UNUSED(t_start_wall);
        UNUSED(t_start_cpu);

        {
            // update the gradient
            ggml_opt_get_grad(np, ps, g1);

            // m_t = beta1*m_t-1 + (1 - beta1)*g_t
            ggml_vec_scale_f32(nx, m, beta1);
            ggml_vec_mad_f32  (nx, m, g1, 1.0f - beta1);

            // g2 = g1^2
            ggml_vec_sqr_f32  (nx, g2, g1);

            // v_t = beta2*v_t-1 + (1 - beta2)*g_t^2
            ggml_vec_scale_f32(nx, v, beta2);
            ggml_vec_mad_f32  (nx, v, g2, 1.0f - beta2);

            // m^hat = m_t / (1 - beta1^t)
            // v^hat = v_t / (1 - beta2^t)
            // x_t = x_t-1 - alpha*m^hat/(sqrt(v^hat) + eps)
            ggml_vec_cpy_f32  (nx, mh, m);
            ggml_vec_cpy_f32  (nx, vh, v);

            ggml_vec_scale_f32(nx, mh, alpha/(1.0f - powf(beta1, t + 1)));
            ggml_vec_scale_f32(nx, vh,  1.0f/(1.0f - powf(beta2, t + 1)));

            ggml_vec_sqrt_f32 (nx, vh, vh);
            ggml_vec_acc1_f32 (nx, vh, eps);

            ggml_vec_div_f32  (nx, mh, mh, vh);
            ggml_vec_sub_f32  (nx, x,  x,  mh);

            // update the parameters
            ggml_opt_set_params(np, ps, x);
        }

        ggml_graph_reset  (gf);
        ggml_set_f32      (f->grad, 1.0f);
        ggml_graph_compute(ctx, gb);

        const float fx = ggml_get_f32_1d(f, 0);

        // check convergence
        if (fabsf(fx - fx_prev)/fx < params.adam.eps_f) {
            GGML_PRINT_DEBUG("converged\n");

            return GGML_OPT_OK;
        }

        // delta-based convergence test
        if (pf != NULL) {
            // need at least params.past iterations to start checking for convergence
            if (params.past <= t) {
                const float rate = (pf[t%params.past] - fx)/fx;

                if (fabs(rate) < params.delta) {
                    return GGML_OPT_OK;
                }
            }

            pf[t%params.past] = fx;
        }

        // check for improvement
        if (params.max_no_improvement > 0) {
            if (fx_best > fx) {
                fx_best = fx;
                n_no_improvement = 0;
            } else {
                ++n_no_improvement;

                if (n_no_improvement >= params.max_no_improvement) {
                    return GGML_OPT_OK;
                }
            }
        }

        fx_prev = fx;

        {
            const int64_t t_end_cpu = ggml_cycles();
            GGML_PRINT_DEBUG("time iter:      %5.3f s\n", ((float)(t_end_cpu - t_start_cpu))/CLOCKS_PER_SEC);
            UNUSED(t_end_cpu);

            const int64_t t_end_wall = ggml_time_us();
            GGML_PRINT_DEBUG("wall time iter: %5.3f s\n", (t_end_wall - t_start_wall)/1e6);
            UNUSED(t_end_wall);
        }
    }

    return GGML_OPT_DID_NOT_CONVERGE;
}